

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphEditor.cc
# Opt level: O2

void __thiscall GraphEditor::apply_all(GraphEditor *this)

{
  sgNodeID_t *psVar1;
  WorkSpace *pWVar2;
  undefined8 uVar3;
  sgNodeID_t sVar4;
  pointer pGVar5;
  pointer pGVar6;
  ulong uVar7;
  ulong uVar8;
  long n;
  int32_t d;
  long lVar9;
  pointer pLVar10;
  pointer pGVar11;
  pointer pGVar12;
  undefined1 local_e0 [40];
  pointer local_b8;
  int32_t local_b0;
  int32_t local_ac;
  vector<GraphEditorNodeDeletion,_std::allocator<GraphEditorNodeDeletion>_> *local_a8;
  vector<GraphEditorLinkDeletion,_std::allocator<GraphEditorLinkDeletion>_> *local_a0;
  vector<GraphEditorNodeExpansion,_std::allocator<GraphEditorNodeExpansion>_> *local_98;
  vector<GraphEditorPathDetachment,_std::allocator<GraphEditorPathDetachment>_> *local_90;
  _Vector_base<long,_std::allocator<long>_> local_88;
  string local_70;
  string local_50;
  
  local_a8 = &this->node_deletion_queue;
  pGVar5 = (this->node_deletion_queue).
           super__Vector_base<GraphEditorNodeDeletion,_std::allocator<GraphEditorNodeDeletion>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pGVar6 = (this->link_deletion_queue).
           super__Vector_base<GraphEditorLinkDeletion,_std::allocator<GraphEditorLinkDeletion>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_a0 = &this->link_deletion_queue;
  local_98 = &this->node_expansion_queue;
  pGVar12 = (this->node_expansion_queue).
            super__Vector_base<GraphEditorNodeExpansion,_std::allocator<GraphEditorNodeExpansion>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_90 = &this->path_detachment_queue;
  pGVar11 = (this->path_detachment_queue).
            super__Vector_base<GraphEditorPathDetachment,_std::allocator<GraphEditorPathDetachment>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (uVar8 = 0; uVar8 < this->next_op; uVar8 = uVar8 + 1) {
    if ((pGVar5 != (this->node_deletion_queue).
                   super__Vector_base<GraphEditorNodeDeletion,_std::allocator<GraphEditorNodeDeletion>_>
                   ._M_impl.super__Vector_impl_data._M_finish) &&
       ((pGVar5->super_GraphEditorOperation).index == uVar8)) {
      lVar9 = *(pGVar5->super_GraphEditorOperation).input_nodes.
               super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
               _M_start;
      n = -lVar9;
      if (0 < lVar9) {
        n = lVar9;
      }
      SequenceDistanceGraph::remove_node(&this->ws->sdg,n);
      pGVar5 = pGVar5 + 1;
    }
    if ((pGVar6 != (this->link_deletion_queue).
                   super__Vector_base<GraphEditorLinkDeletion,_std::allocator<GraphEditorLinkDeletion>_>
                   ._M_impl.super__Vector_impl_data._M_finish) &&
       ((pGVar6->super_GraphEditorOperation).index == uVar8)) {
      psVar1 = (pGVar6->super_GraphEditorOperation).input_ends.
               super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
               _M_start;
      DistanceGraph::remove_link((DistanceGraph *)this->ws,*psVar1,psVar1[1]);
      pGVar6 = pGVar6 + 1;
    }
    if ((pGVar12 !=
         (this->node_expansion_queue).
         super__Vector_base<GraphEditorNodeExpansion,_std::allocator<GraphEditorNodeExpansion>_>.
         _M_impl.super__Vector_impl_data._M_finish) &&
       ((pGVar12->super_GraphEditorOperation).index == uVar8)) {
      lVar9 = 0;
      uVar7 = 0;
      local_b8 = pGVar5;
      while( true ) {
        pWVar2 = this->ws;
        sVar4 = *(pGVar12->super_GraphEditorOperation).input_nodes.
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        if ((ulong)((long)(pGVar12->super_GraphEditorOperation).input_ends.
                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(pGVar12->super_GraphEditorOperation).input_ends.
                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) >> 1 <= uVar7) break;
        SequenceDistanceGraph::get_node_sequence_abi_cxx11_(&local_50,&pWVar2->sdg,sVar4);
        sVar4 = SequenceDistanceGraph::add_node(&pWVar2->sdg,&local_50,true);
        std::__cxx11::string::~string((string *)&local_50);
        DistanceGraph::get_link
                  ((Link *)local_e0,(DistanceGraph *)this->ws,
                   *(sgNodeID_t *)
                    ((long)(pGVar12->super_GraphEditorOperation).input_ends.
                           super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar9),
                   *(pGVar12->super_GraphEditorOperation).input_nodes.
                    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                    _M_start);
        DistanceGraph::add_link
                  ((DistanceGraph *)this->ws,
                   *(sgNodeID_t *)
                    ((long)(pGVar12->super_GraphEditorOperation).input_ends.
                           super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar9),sVar4,local_e0._16_4_,
                   (Support)ZEXT816(0));
        DistanceGraph::get_link
                  ((Link *)local_e0,(DistanceGraph *)this->ws,
                   -*(pGVar12->super_GraphEditorOperation).input_nodes.
                     super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                     ._M_start,
                   *(sgNodeID_t *)
                    ((long)(pGVar12->super_GraphEditorOperation).input_ends.
                           super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar9 + 8));
        DistanceGraph::add_link
                  ((DistanceGraph *)this->ws,-sVar4,
                   *(sgNodeID_t *)
                    ((long)(pGVar12->super_GraphEditorOperation).input_ends.
                           super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar9 + 8),local_e0._16_4_,
                   (Support)ZEXT816(0));
        uVar7 = uVar7 + 1;
        lVar9 = lVar9 + 0x10;
      }
      SequenceDistanceGraph::remove_node(&pWVar2->sdg,sVar4);
      pGVar12 = pGVar12 + 1;
      pGVar5 = local_b8;
    }
    if ((pGVar11 !=
         (this->path_detachment_queue).
         super__Vector_base<GraphEditorPathDetachment,_std::allocator<GraphEditorPathDetachment>_>.
         _M_impl.super__Vector_impl_data._M_finish) &&
       ((pGVar11->super_GraphEditorOperation).index == uVar8)) {
      if ((pGVar11->super_GraphEditorOperation).input_nodes.
          super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
          == (pGVar11->super_GraphEditorOperation).input_nodes.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish) {
        if (pGVar11->full_detach == true) {
          DistanceGraph::get_fw_links
                    ((vector<Link,_std::allocator<Link>_> *)local_e0,(DistanceGraph *)this->ws,
                     -*(pGVar11->super_GraphEditorOperation).input_ends.
                       super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start);
          uVar3 = local_e0._8_8_;
          for (pLVar10 = (pointer)local_e0._0_8_; pLVar10 != (pointer)uVar3; pLVar10 = pLVar10 + 1)
          {
            if (pLVar10->dest !=
                (pGVar11->super_GraphEditorOperation).input_ends.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start[1]) {
              DistanceGraph::remove_link((DistanceGraph *)this->ws,pLVar10->source,pLVar10->dest);
            }
          }
          std::_Vector_base<Link,_std::allocator<Link>_>::~_Vector_base
                    ((_Vector_base<Link,_std::allocator<Link>_> *)local_e0);
          DistanceGraph::get_bw_links
                    ((vector<Link,_std::allocator<Link>_> *)local_e0,(DistanceGraph *)this->ws,
                     (pGVar11->super_GraphEditorOperation).input_ends.
                     super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                     ._M_start[1]);
          uVar3 = local_e0._8_8_;
          for (pLVar10 = (pointer)local_e0._0_8_; pLVar10 != (pointer)uVar3; pLVar10 = pLVar10 + 1)
          {
            if (pLVar10->dest !=
                *(pGVar11->super_GraphEditorOperation).input_ends.
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_start) {
              DistanceGraph::remove_link((DistanceGraph *)this->ws,pLVar10->source,pLVar10->dest);
            }
          }
          std::_Vector_base<Link,_std::allocator<Link>_>::~_Vector_base
                    ((_Vector_base<Link,_std::allocator<Link>_> *)local_e0);
        }
      }
      else {
        pWVar2 = this->ws;
        local_b8 = pGVar5;
        std::vector<long,_std::allocator<long>_>::vector
                  ((vector<long,_std::allocator<long>_> *)&local_88,
                   &(pGVar11->super_GraphEditorOperation).input_nodes);
        std::vector<long,_std::allocator<long>_>::vector
                  ((vector<long,_std::allocator<long>_> *)local_e0,
                   (vector<long,_std::allocator<long>_> *)&local_88);
        local_e0._24_8_ = pWVar2;
        SequenceDistanceGraphPath::sequence_abi_cxx11_
                  (&local_70,(SequenceDistanceGraphPath *)local_e0);
        sVar4 = SequenceDistanceGraph::add_node(&pWVar2->sdg,&local_70,true);
        std::__cxx11::string::~string((string *)&local_70);
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                  ((_Vector_base<long,_std::allocator<long>_> *)local_e0);
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_88);
        DistanceGraph::get_link
                  ((Link *)local_e0,(DistanceGraph *)this->ws,
                   *(pGVar11->super_GraphEditorOperation).input_ends.
                    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                    _M_start,
                   *(pGVar11->super_GraphEditorOperation).input_nodes.
                    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                    _M_start);
        local_ac = local_e0._16_4_;
        DistanceGraph::get_link
                  ((Link *)local_e0,(DistanceGraph *)this->ws,
                   -(pGVar11->super_GraphEditorOperation).input_nodes.
                    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                    _M_finish[-1],
                   (pGVar11->super_GraphEditorOperation).input_ends.
                   super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                   _M_start[1]);
        d = local_e0._16_4_;
        if (pGVar11->full_detach == true) {
          local_b0 = local_e0._16_4_;
          DistanceGraph::get_fw_links
                    ((vector<Link,_std::allocator<Link>_> *)local_e0,(DistanceGraph *)this->ws,
                     -*(pGVar11->super_GraphEditorOperation).input_ends.
                       super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start);
          uVar3 = local_e0._8_8_;
          for (pLVar10 = (pointer)local_e0._0_8_; pLVar10 != (pointer)uVar3; pLVar10 = pLVar10 + 1)
          {
            DistanceGraph::remove_link((DistanceGraph *)this->ws,pLVar10->source,pLVar10->dest);
          }
          std::_Vector_base<Link,_std::allocator<Link>_>::~_Vector_base
                    ((_Vector_base<Link,_std::allocator<Link>_> *)local_e0);
          DistanceGraph::get_bw_links
                    ((vector<Link,_std::allocator<Link>_> *)local_e0,(DistanceGraph *)this->ws,
                     (pGVar11->super_GraphEditorOperation).input_ends.
                     super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                     ._M_start[1]);
          uVar3 = local_e0._8_8_;
          for (pLVar10 = (pointer)local_e0._0_8_; pLVar10 != (pointer)uVar3; pLVar10 = pLVar10 + 1)
          {
            DistanceGraph::remove_link((DistanceGraph *)this->ws,pLVar10->source,pLVar10->dest);
          }
          std::_Vector_base<Link,_std::allocator<Link>_>::~_Vector_base
                    ((_Vector_base<Link,_std::allocator<Link>_> *)local_e0);
          d = local_b0;
        }
        else {
          DistanceGraph::remove_link
                    ((DistanceGraph *)this->ws,
                     *(pGVar11->super_GraphEditorOperation).input_ends.
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                     *(pGVar11->super_GraphEditorOperation).input_nodes.
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start);
          DistanceGraph::remove_link
                    ((DistanceGraph *)this->ws,
                     -(pGVar11->super_GraphEditorOperation).input_nodes.
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1],
                     (pGVar11->super_GraphEditorOperation).input_ends.
                     super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                     ._M_start[1]);
        }
        DistanceGraph::add_link
                  ((DistanceGraph *)this->ws,
                   *(pGVar11->super_GraphEditorOperation).input_ends.
                    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                    _M_start,sVar4,local_ac,(Support)ZEXT816(0));
        DistanceGraph::add_link
                  ((DistanceGraph *)this->ws,-sVar4,
                   (pGVar11->super_GraphEditorOperation).input_ends.
                   super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                   _M_start[1],d,(Support)ZEXT816(0));
        pGVar5 = local_b8;
      }
      pGVar11 = pGVar11 + 1;
    }
  }
  std::vector<GraphEditorNodeDeletion,_std::allocator<GraphEditorNodeDeletion>_>::clear(local_a8);
  std::vector<GraphEditorLinkDeletion,_std::allocator<GraphEditorLinkDeletion>_>::clear(local_a0);
  std::vector<GraphEditorNodeExpansion,_std::allocator<GraphEditorNodeExpansion>_>::clear(local_98);
  std::vector<GraphEditorPathDetachment,_std::allocator<GraphEditorPathDetachment>_>::clear
            (local_90);
  this->next_op = 0;
  return;
}

Assistant:

void GraphEditor::apply_all() {
    auto next_node_deletion=node_deletion_queue.begin();
    auto next_link_deletion=link_deletion_queue.begin();
    auto next_expansion=node_expansion_queue.begin();
    auto next_detachment=path_detachment_queue.begin();
    for (uint64_t i=0;i<next_op;++i) {
//    sdglib::OutputLog()<<"Applying all graph edits: "<<node_deletion_queue.size()<<" node deletions, "
//            <<link_deletion_queue.size()<<" link deletions, "
//            <<node_expansion_queue.size()<<" node expansions, "
//            <<path_detachment_queue.size()<<" path detachments"<<std::endl;
        if (next_node_deletion!=node_deletion_queue.end() and next_node_deletion->index==i) {
            auto &op=*next_node_deletion;
            ws.sdg.remove_node(llabs(op.input_nodes[0]));
            ++next_node_deletion;
        }
        if (next_link_deletion!=link_deletion_queue.end() and next_link_deletion->index==i) {
            auto &op=*next_link_deletion;
            ws.sdg.remove_link(op.input_ends[0],op.input_ends[1]);
            ++next_link_deletion;
        }
        if (next_expansion!=node_expansion_queue.end() and next_expansion->index==i) {
            auto &op=*next_expansion;
            for (auto li = 0; li < op.input_ends.size() / 2; ++li) {
                //create a copy of the node;
                auto new_node = ws.sdg.add_node(ws.sdg.get_node_sequence(op.input_nodes[0]));
                //connect to the sides
                auto source_dist = ws.sdg.get_link(op.input_ends[2 * li], op.input_nodes[0]).dist;
                ws.sdg.add_link(op.input_ends[2 * li], new_node, source_dist);
                auto dest_dist = ws.sdg.get_link(-op.input_nodes[0], op.input_ends[2 * li + 1]).dist;
                ws.sdg.add_link(-new_node, op.input_ends[2 * li + 1], dest_dist);
            }
            ws.sdg.remove_node(op.input_nodes[0]);
            ++next_expansion;
        }
        if (next_detachment!=path_detachment_queue.end() and next_detachment->index==i) {
            auto &op=*next_detachment;
            //special case: path with just ends
            if (op.input_nodes.empty()) {
                if ( op.full_detach ) {
                    for (auto l:ws.sdg.get_fw_links(-op.input_ends[0]))
                        if (l.dest != op.input_ends[1]) ws.sdg.remove_link(l.source, l.dest);
                    for (auto l:ws.sdg.get_bw_links(op.input_ends[1]))
                        if (l.dest != op.input_ends[0]) ws.sdg.remove_link(l.source, l.dest);

                }
            } else {
                //Create a unitig with the internal path sequence
                auto new_node = ws.sdg.add_node(SequenceDistanceGraphPath(ws.sdg, op.input_nodes).sequence());
                auto first_dist = ws.sdg.get_link(op.input_ends[0], op.input_nodes.front()).dist;
                auto last_dist = ws.sdg.get_link(-op.input_nodes.back(), op.input_ends[1]).dist;
                if ( op.full_detach ) {
                    for (auto l:ws.sdg.get_fw_links(-op.input_ends[0])) ws.sdg.remove_link(l.source, l.dest);
                    for (auto l:ws.sdg.get_bw_links(op.input_ends[1])) ws.sdg.remove_link(l.source, l.dest);
                }
                else {
                    ws.sdg.remove_link(op.input_ends[0], op.input_nodes.front());
                    ws.sdg.remove_link(-op.input_nodes.back(), op.input_ends[1]);
                }
                ws.sdg.add_link(op.input_ends[0], new_node, first_dist);
                ws.sdg.add_link(-new_node, op.input_ends[1], last_dist);
            }
            ++next_detachment;
        }

    }
    node_deletion_queue.clear();
    link_deletion_queue.clear();
    node_expansion_queue.clear();
    path_detachment_queue.clear();
    next_op=0;
}